

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textrender.h
# Opt level: O0

void __thiscall CTextCursor::CTextCursor(CTextCursor *this)

{
  CTextCursor *in_RDI;
  array<CScaledGlyph,_allocator_default<CScaledGlyph>_> *StringVersion;
  float in_stack_ffffffffffffffe8;
  float in_stack_ffffffffffffffec;
  CTextCursor *in_stack_fffffffffffffff0;
  
  vector2_base<float>::vector2_base(&in_RDI->m_CursorPos);
  vector2_base<float>::vector2_base(&in_RDI->m_Advance);
  StringVersion = &in_RDI->m_Glyphs;
  array<CScaledGlyph,_allocator_default<CScaledGlyph>_>::array
            ((array<CScaledGlyph,_allocator_default<CScaledGlyph>_> *)0x1455c0);
  Set(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
      (float)((ulong)in_RDI >> 0x20),(int)in_RDI);
  Reset(in_RDI,(int64)StringVersion);
  return;
}

Assistant:

CTextCursor() { Set(10.0f, 0, 0, 0); Reset(); }